

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::locate_sof_marker(jpeg_decoder *this)

{
  int iVar1;
  int c;
  jpeg_decoder *this_local;
  
  locate_soi_marker(this);
  iVar1 = process_markers(this);
  if (iVar1 - 0xc0U < 2) {
    read_sof_marker(this);
  }
  else {
    if (iVar1 != 0xc2) {
      if (iVar1 != 0xc9) {
        stop_decoding(this,JPGD_UNSUPPORTED_MARKER);
      }
      stop_decoding(this,JPGD_NO_ARITHMITIC_SUPPORT);
    }
    this->m_progressive_flag = 1;
    read_sof_marker(this);
  }
  return;
}

Assistant:

void jpeg_decoder::locate_sof_marker()
	{
		locate_soi_marker();

		int c = process_markers();

		switch (c)
		{
		case M_SOF2:
		{
			m_progressive_flag = JPGD_TRUE;
			read_sof_marker();
			break;
		}
		case M_SOF0:  /* baseline DCT */
		case M_SOF1:  /* extended sequential DCT */
		{
			read_sof_marker();
			break;
		}
		case M_SOF9:  /* Arithmitic coding */
		{
			stop_decoding(JPGD_NO_ARITHMITIC_SUPPORT);
			break;
		}
		default:
		{
			stop_decoding(JPGD_UNSUPPORTED_MARKER);
			break;
		}
		}
	}